

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall Centaurus::LDFAState<wchar_t>::print(LDFAState<wchar_t> *this,wostream *os,int from)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_00;
  reference this_01;
  wostream *pwVar3;
  CharClass<wchar_t> *cc;
  NFATransition<wchar_t> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range2;
  int from_local;
  wostream *os_local;
  LDFAState<wchar_t> *this_local;
  
  this_00 = &(this->
             super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
             ).m_transitions;
  __end0 = std::
           vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ::begin(this_00);
  t = (NFATransition<wchar_t> *)
      std::
      vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
              ::operator*(&__end0);
    pwVar3 = std::operator<<(os,L"S");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    std::operator<<(pwVar3,L" -> ");
    iVar2 = NFATransition<wchar_t>::dest(this_01);
    if (iVar2 < 0) {
      pwVar3 = std::operator<<(os,L"A");
      iVar2 = NFATransition<wchar_t>::dest(this_01);
      std::wostream::operator<<(pwVar3,-iVar2);
    }
    else {
      pwVar3 = std::operator<<(os,L"S");
      iVar2 = NFATransition<wchar_t>::dest(this_01);
      std::wostream::operator<<(pwVar3,iVar2);
    }
    std::operator<<(os,L" [ label=\"");
    cc = NFATransition<wchar_t>::label(this_01);
    Centaurus::operator<<(os,cc);
    pwVar3 = std::operator<<(os,L"\" ];");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const override
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> ";
            if (t.dest() < 0)
            {
                os << L"A" << -t.dest();
            }
            else
            {
                os << L"S" << t.dest();
            }
            os << L" [ label=\"";
			os << t.label();
			os << L"\" ];" << std::endl;
		}
	}